

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

void __thiscall presolve::HPresolve::removeRow(HPresolve *this,HighsInt row)

{
  uint *puVar1;
  uint *puVar2;
  
  markRowDeleted(this,row);
  getRowPositions(this,row,&this->rowpositions);
  puVar1 = (uint *)(this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  for (puVar2 = (uint *)(this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    unlink(this,(char *)(ulong)*puVar2);
  }
  return;
}

Assistant:

void HPresolve::removeRow(HighsInt row) {
  assert(row >= 0);
  assert(static_cast<size_t>(row) < rowroot.size());
  // first mark the row as logically deleted, so that it is not register as
  // singleton row upon removing its nonzeros
  markRowDeleted(row);
  storeRow(row);
  for (HighsInt rowiter : rowpositions) {
    assert(Arow[rowiter] == row);
    unlink(rowiter);
  }
}